

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::RandCaseStatement::fromSyntax
          (Compilation *compilation,RandCaseStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  sockaddr *__addr;
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_RCX;
  sockaddr *in_RDX;
  EVP_PKEY_CTX *src;
  SourceRange *extraout_RDX;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  RandCaseStatement *result;
  Statement *stmt;
  Expression *expr;
  RandCaseItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *__range2;
  SmallVector<slang::ast::RandCaseStatement::Item,_8UL> items;
  bool bad;
  Statement *in_stack_fffffffffffffe38;
  SmallVectorBase<slang::ast::RandCaseStatement::Item> *in_stack_fffffffffffffe40;
  span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffe48;
  Expression *in_stack_fffffffffffffe60;
  SourceRange *args_1;
  ASTContext *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  Expression *in_stack_fffffffffffffe90;
  Statement *local_130;
  Expression *local_128;
  not_null<const_slang::ast::Expression_*> local_120;
  not_null<const_slang::ast::Statement_*> local_118;
  Statement *local_110;
  bitmask<slang::ast::ASTFlags> local_108 [3];
  Expression *local_f0;
  RandCaseItemSyntax *local_e8;
  RandCaseItemSyntax **local_e0;
  __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
  local_d8;
  long local_d0;
  SmallVectorBase<slang::ast::RandCaseStatement::Item> local_c8 [3];
  byte local_29;
  undefined8 local_28;
  sockaddr *local_20;
  long local_18;
  EVP_PKEY_CTX *local_10;
  Compilation *local_8;
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *args;
  
  local_29 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SmallVector<slang::ast::RandCaseStatement::Item,_8UL>::SmallVector
            ((SmallVector<slang::ast::RandCaseStatement::Item,_8UL> *)0xa4e55c);
  local_d0 = local_18 + 0x68;
  local_d8._M_current =
       (RandCaseItemSyntax **)
       std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe38);
  local_e0 = (RandCaseItemSyntax **)
             std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::end
                       (in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe40,
                            (__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe38), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppRVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_d8);
    local_e8 = *ppRVar3;
    pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa4e5eb);
    __addr = local_20;
    bitmask<slang::ast::ASTFlags>::bitmask(local_108,None);
    iVar2 = Expression::bind((int)pEVar4,__addr,(socklen_t)local_108[0].m_bits);
    in_stack_fffffffffffffe90 = (Expression *)CONCAT44(extraout_var,iVar2);
    local_f0 = in_stack_fffffffffffffe90;
    pSVar5 = not_null<slang::syntax::StatementSyntax_*>::operator*
                       ((not_null<slang::syntax::StatementSyntax_*> *)0xa4e64c);
    iVar2 = Statement::bind((int)pSVar5,local_20,(socklen_t)local_28);
    local_110 = (Statement *)CONCAT44(extraout_var_00,iVar2);
    local_128 = local_f0;
    not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
              (&local_120,&local_128);
    local_130 = local_110;
    not_null<const_slang::ast::Statement_*>::not_null<const_slang::ast::Statement_*>
              (&local_118,&local_130);
    SmallVectorBase<slang::ast::RandCaseStatement::Item>::push_back
              (in_stack_fffffffffffffe40,(Item *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe77 = Statement::bad(local_110);
    if (((bool)in_stack_fffffffffffffe77) ||
       (in_stack_fffffffffffffe76 =
             ASTContext::requireIntegral(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60),
       !(bool)in_stack_fffffffffffffe76)) {
      local_29 = 1;
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_d8);
  }
  iVar2 = SmallVectorBase<slang::ast::RandCaseStatement::Item>::copy(local_c8,local_10,src);
  args = (span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *)
         CONCAT44(extraout_var_01,iVar2);
  args_1 = extraout_RDX;
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe90);
  local_8 = (Compilation *)
            BumpAllocator::
            emplace<slang::ast::RandCaseStatement,std::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
                      ((BumpAllocator *)
                       CONCAT17(in_stack_fffffffffffffe77,
                                CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),args,
                       args_1);
  if ((local_29 & 1) != 0) {
    local_8 = (Compilation *)Statement::badStmt(local_8,in_stack_fffffffffffffe38);
  }
  SmallVector<slang::ast::RandCaseStatement::Item,_8UL>::~SmallVector
            ((SmallVector<slang::ast::RandCaseStatement::Item,_8UL> *)0xa4e86a);
  return (Statement *)local_8;
}

Assistant:

Statement& RandCaseStatement::fromSyntax(Compilation& compilation,
                                         const RandCaseStatementSyntax& syntax,
                                         const ASTContext& context, StatementContext& stmtCtx) {
    bool bad = false;
    SmallVector<Item, 8> items;
    for (auto item : syntax.items) {
        auto& expr = Expression::bind(*item->expr, context);
        auto& stmt = Statement::bind(*item->statement, context, stmtCtx);
        items.push_back({&expr, &stmt});

        if (stmt.bad() || !context.requireIntegral(expr)) {
            bad = true;
        }
    }

    auto result = compilation.emplace<RandCaseStatement>(items.copy(compilation),
                                                         syntax.sourceRange());
    if (bad)
        return badStmt(compilation, result);

    return *result;
}